

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int vocisect(objnum *list1,objnum *list2)

{
  int k;
  int j;
  int i;
  objnum *list2_local;
  objnum *list1_local;
  
  k = 0;
  i = 0;
  do {
    if (list1[i] == 0xffff) {
      list1[k] = 0xffff;
      return k;
    }
    for (j = 0; list2[j] != 0xffff; j = j + 1) {
      if (list1[i] == list2[j]) {
        list1[k] = list1[i];
        k = k + 1;
        break;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static int vocisect(objnum *list1, objnum *list2)
{
    int i, j, k;

    for (i = k = 0 ; list1[i] != MCMONINV ; ++i)
    {
        for (j = 0 ; list2[j] != MCMONINV ; ++j)
        {
            if (list1[i] == list2[j])
            {
                list1[k++] = list1[i];
                break;
            }
        }
    }
    list1[k] = MCMONINV;
    return(k);
}